

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererParallelTests::RendererPopulatesBitmapWithMaskDataAccordingToWindow
          (RendererParallelTests *this)

{
  cell *pcVar1;
  cell *pcVar2;
  allocator local_221;
  string local_220 [32];
  LocationInfo local_200;
  uchar auStack_1d8 [8];
  uint8_t reference1 [44];
  simple_alpha<unsigned_char,_8UL> local_1a1;
  agge_vector<int> local_1a0;
  undefined1 auStack_198 [8];
  rect_i window1;
  renderer_parallel r;
  blender<unsigned_char,_unsigned_char> blender1;
  undefined1 local_130 [8];
  bitmap<unsigned_char,_0UL,_0UL> bitmap1;
  mask_full<8UL> mask1;
  scanline_cells cells [4];
  cell cells4 [2];
  undefined1 auStack_88 [8];
  cell cells3 [2];
  undefined1 auStack_68 [8];
  cell cells2 [3];
  undefined1 auStack_38 [8];
  cell cells1 [3];
  RendererParallelTests *this_local;
  
  auStack_38._0_4_ = 0;
  auStack_38._4_4_ = 0;
  cells1[0].x = 0x11;
  cells1[0].area = 3;
  cells1[0].cover = 0;
  cells1[1].x = -3;
  cells1[1].area = 7;
  cells1[1].cover = 0;
  cells1[2].x = -0xe;
  auStack_68._0_4_ = 6;
  auStack_68._4_4_ = 0;
  cells2[0].x = 0xab;
  cells2[0].area = 9;
  cells2[0].cover = 0;
  cells2[1].x = -0x1e;
  cells2[1].area = 10;
  cells2[1].cover = 0;
  cells2[2].x = -0x8d;
  cells3[0].cover = 0;
  cells3[1].x = -0xa0;
  auStack_88._0_4_ = 1;
  auStack_88._4_4_ = 0;
  cells3[0].x = 0xa0;
  cells3[0].area = 9;
  cells[3].second = (cell *)0x1;
  unique0x1000067e = this;
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_38);
  join_0x00000010_0x00000000_ =
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  pcVar2 = end<agge::tests::mocks::cell_const,3ul>((cell (*) [3])auStack_68);
  cells._8_16_ = (undefined1  [16])
                 std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                           (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_88);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_88);
  cells._24_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[3].second);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[3].second);
  cells._40_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  tests::mocks::mask_full<8ul>::
  mask_full<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask_full<8ul> *)&bitmap1._width,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [4])
             &mask1.super_mask<8UL>._cells.
              super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_130,0xb,4);
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)&r._parallelism);
  renderer_parallel::renderer_parallel((renderer_parallel *)&window1.x2,2);
  auStack_198._0_4_ = 5;
  auStack_198._4_4_ = 3;
  window1.x1 = 7;
  window1.y1 = 6;
  local_1a0 = mkvector<int>(-1,3);
  renderer_parallel::operator()
            ((renderer_parallel *)&window1.x2,(bitmap<unsigned_char,_0UL,_0UL> *)local_130,local_1a0
             ,(rect_i *)auStack_198,(mask_full<8UL> *)&bitmap1._width,
             (blender<unsigned_char,_unsigned_char> *)&r._parallelism,&local_1a1);
  reference1[0x18] = '\0';
  reference1[0x19] = '\0';
  reference1[0x1a] = '\0';
  reference1[0x1b] = '\0';
  reference1[0x1c] = '\0';
  reference1[0x1d] = '\0';
  reference1[0x1e] = '\0';
  reference1[0x1f] = '\0';
  reference1[0x20] = '\0';
  reference1[0x21] = '\0';
  reference1[0x22] = '\0';
  reference1[0x23] = '\0';
  reference1[0x10] = '\0';
  reference1[0x11] = '\0';
  reference1[0x12] = '\0';
  reference1[0x13] = '\0';
  reference1[0x16] = '\0';
  reference1[0x17] = '\0';
  reference1[0] = '\0';
  reference1[1] = '\0';
  reference1[2] = '\0';
  reference1[3] = '\0';
  reference1[4] = '\0';
  reference1[5] = '\0';
  reference1[6] = '\0';
  reference1[7] = '\0';
  auStack_1d8[0] = '\0';
  auStack_1d8[1] = '\0';
  auStack_1d8[2] = '\0';
  auStack_1d8[3] = '\0';
  auStack_1d8[4] = '\0';
  auStack_1d8[5] = '\0';
  auStack_1d8[6] = '\x0e';
  auStack_1d8[7] = '\x0e';
  reference1[8] = '\0';
  reference1[9] = '\0';
  reference1[10] = 0xab;
  reference1[0xb] = '\0';
  reference1[0xc] = '\0';
  reference1[0xd] = '\0';
  reference1[0xe] = '\0';
  reference1[0xf] = '\0';
  reference1[0x14] = 0xa0;
  reference1[0x15] = 0xa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_221);
  ut::LocationInfo::LocationInfo(&local_200,(string *)local_220,0xd5);
  ut::are_equal<unsigned_char,44ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [44])auStack_1d8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,&local_200);
  ut::LocationInfo::~LocationInfo(&local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  renderer_parallel::~renderer_parallel((renderer_parallel *)&window1.x2);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)&r._parallelism);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_130);
  tests::mocks::mask_full<8UL>::~mask_full((mask_full<8UL> *)&bitmap1._width);
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordingToWindow )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 3, 0, -0x03 }, { 7, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 6, 0, 0xAB }, { 9, 0, -0x1E }, { 10, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 9, 0, -0x10 }, };
				const mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
				};
				const mocks::mask_full<8> mask1(cells, 3);
				mocks::bitmap<uint8_t> bitmap1(11, 4);
				mocks::blender<uint8_t, uint8_t> blender1;

				renderer_parallel r(2);

				// ACT
				const rect_i window1 = { 5, 3, 7, 6 };
				r(bitmap1, mkvector(-1, 3), &window1, mask1, blender1, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x0E, 0x0E, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap1.data);
			}